

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracing.cpp
# Opt level: O0

Vec3 compute_background_color(Ray *ray)

{
  Vec3 *in_RDI;
  undefined8 extraout_XMM0_Qa;
  Vec3 VVar2;
  float _t;
  Vec3 _unit_dir;
  Vec3 _b;
  Vec3 _a;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  Vec3 local_4c;
  Vec3 local_40;
  float in_stack_ffffffffffffffcc;
  Vec3 *in_stack_ffffffffffffffd0;
  Vec3 *in_stack_ffffffffffffffd8;
  Vec3 local_1c [2];
  float fVar1;
  
  Vec3::Vec3(local_1c,0.0,0.0,0.0);
  Vec3::Vec3((Vec3 *)&stack0xffffffffffffffd8,0.15,0.15,0.15);
  Ray::GetDirection((Ray *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  unit_vector(in_RDI);
  Vec3::~Vec3(&local_4c);
  Vec3::y(&local_40);
  VVar2 = lerp<Vec3>(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  fVar1 = VVar2.e[2];
  Vec3::~Vec3(&local_40);
  Vec3::~Vec3((Vec3 *)&stack0xffffffffffffffd8);
  Vec3::~Vec3(local_1c);
  VVar2.e[2] = fVar1;
  VVar2.e[0] = (float)(int)extraout_XMM0_Qa;
  VVar2.e[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vec3)VVar2.e;
}

Assistant:

Vec3
compute_background_color(const Ray& ray)
{
    // Background color
    const Vec3  _a(0.0f,0.0f,0.0f);
    const Vec3  _b(0.15f,0.15f,0.15f);

    const Vec3  _unit_dir = unit_vector(ray.GetDirection());  
    const float _t = 0.5f * (_unit_dir.y() + 1.0f); // [-1,1] -> [0,1]

    return lerp(_a, _b, _t);
}